

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaClassesRefine(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRefinedC;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                  ,0x11c,"int Ssc_GiaClassesRefine(Gia_Man_t *)");
  }
  p_00 = Vec_IntAlloc(100);
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->nObjs) {
      _Counter = Gia_ManObj(p,local_24);
      bVar2 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsCand(_Counter);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsTail(p,local_24);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsConst(p,local_24);
        if ((iVar1 != 0) && (iVar1 = Ssc_GiaSimIsConst0(p,local_24), iVar1 == 0)) {
          Vec_IntPush(p_00,local_24);
        }
      }
      else {
        iVar1 = Gia_ObjRepr(p,local_24);
        iVar1 = Ssc_GiaSimClassRefineOne(p,iVar1);
        local_28 = iVar1 + local_28;
      }
    }
    local_24 = local_24 + 1;
  }
  Ssc_GiaSimProcessRefined(p,p_00);
  iVar1 = Vec_IntSize(p_00);
  Vec_IntFree(p_00);
  return iVar1 + local_28;
}

Assistant:

int Ssc_GiaClassesRefine( Gia_Man_t * p )
{
    Vec_Int_t * vRefinedC;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->pReprs != NULL );
    vRefinedC = Vec_IntAlloc( 100 );
    Gia_ManForEachCand( p, pObj, i )
        if ( Gia_ObjIsTail(p, i) )
            Counter += Ssc_GiaSimClassRefineOne( p, Gia_ObjRepr(p, i) );
        else if ( Gia_ObjIsConst(p, i) && !Ssc_GiaSimIsConst0(p, i) )
            Vec_IntPush( vRefinedC, i );
    Ssc_GiaSimProcessRefined( p, vRefinedC );
    Counter += Vec_IntSize( vRefinedC );
    Vec_IntFree( vRefinedC );
    return Counter;
}